

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall
setup::info::load_entries<setup::message_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::message_entry,_std::allocator<setup::message_entry>_> *result,
          enum_type entry_type)

{
  TypesafeBoolean p_Var1;
  ulong in_RCX;
  flags<setup::info::entry_types_Enum_,_21UL> *in_RDI;
  vector<setup::message_entry,_std::allocator<setup::message_entry>_> *in_R8;
  message_entry entry;
  size_t i_1;
  size_t i;
  info *in_stack_00000130;
  istream *in_stack_00000138;
  message_entry *in_stack_00000140;
  undefined8 in_stack_ffffffffffffff50;
  enum_type flag;
  message_entry *this_00;
  size_type in_stack_ffffffffffffff68;
  vector<setup::message_entry,_std::allocator<setup::message_entry>_> *in_stack_ffffffffffffff70;
  ulong local_48;
  ulong local_40;
  
  flag = (enum_type)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  std::vector<setup::message_entry,_std::allocator<setup::message_entry>_>::clear
            ((vector<setup::message_entry,_std::allocator<setup::message_entry>_> *)0x179de1);
  flags<setup::info::entry_types_Enum_,_21UL>::operator&(in_RDI,flag);
  p_Var1 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x179e0a);
  if (p_Var1 == (TypesafeBoolean)0x0) {
    for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
      this_00 = (message_entry *)&stack0xffffffffffffff70;
      message_entry::message_entry(this_00);
      message_entry::load(in_stack_00000140,in_stack_00000138,in_stack_00000130);
      message_entry::~message_entry
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00);
    }
  }
  else {
    std::vector<setup::message_entry,_std::allocator<setup::message_entry>_>::resize
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
      std::vector<setup::message_entry,_std::allocator<setup::message_entry>_>::operator[]
                (in_R8,local_40);
      message_entry::load(in_stack_00000140,in_stack_00000138,in_stack_00000130);
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}